

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O1

int run_test(test_ctx context,test_vector vec,char *test_name)

{
  int iVar1;
  uint uVar2;
  uint8_t *__s;
  char *d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  
  __s = (uint8_t *)malloc(0x83);
  d = (char *)calloc(vec.input_len,1);
  if (0 < (int)(uint)vec.input_len) {
    uVar3 = (ulong)((uint)vec.input_len & 0x7fffffff);
    uVar4 = 0;
    pcVar7 = d;
    do {
      *pcVar7 = (char)(uVar4 / 0xfb) * '\x05' + (char)uVar4;
      pcVar7 = pcVar7 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 0;
  do {
    memset(__s,0,0x83);
    iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)context.ctx,(EVP_MD *)context.md,(ENGINE *)0x0);
    if (iVar1 != 1) {
      run_test_cold_1();
LAB_00101567:
      uVar6 = 0;
      bVar8 = false;
      goto LAB_001014f7;
    }
    iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)context.ctx,d,vec.input_len);
    if (iVar1 != 1) {
      run_test_cold_2();
      goto LAB_00101567;
    }
    iVar1 = EVP_DigestFinalXOF(context.ctx,__s,uVar3);
    if (iVar1 != 1) {
      run_test_cold_3();
      goto LAB_00101567;
    }
    bVar8 = uVar3 != 0;
    if (bVar8) {
      bVar8 = true;
      if (*__s == *vec.hash) {
        uVar4 = 1;
        do {
          uVar5 = uVar4;
          if (uVar3 == uVar5) break;
          uVar4 = uVar5 + 1;
        } while (__s[uVar5] == vec.hash[uVar5]);
        bVar8 = uVar5 < uVar3;
      }
    }
    if (bVar8 != false) {
      uVar6 = (uint)bVar8;
      fprintf(_stderr,"%s-%i Failed\n",test_name,uVar3 & 0xffffffff);
      bVar8 = true;
      goto LAB_001014f7;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x84);
  bVar8 = true;
  uVar6 = 0;
LAB_001014f7:
  uVar2 = 1;
  if (bVar8) {
    if (uVar6 == 0) {
      printf("%s passed!\n",test_name);
    }
    free(__s);
    free(d);
    uVar2 = uVar6;
  }
  return uVar2;
}

Assistant:

int run_test(struct test_ctx context, struct test_vector vec, char *test_name)
{
	uint8_t *out_buf;
	uint8_t *in_buf;
	int ret = 0;

	out_buf = (uint8_t *)malloc(TEST_HASH_LEN);
	in_buf = (uint8_t *)calloc(vec.input_len, 1);
	generate_input(in_buf, vec.input_len);

	for (int out_len = 0; out_len <= TEST_HASH_LEN; out_len++) {
		memset(out_buf, 0, TEST_HASH_LEN);

		TEST_TRUE(EVP_DigestInit_ex(context.ctx, context.md, NULL));
		TEST_TRUE(EVP_DigestUpdate(context.ctx, in_buf, vec.input_len));
		TEST_TRUE(EVP_DigestFinalXOF(context.ctx, out_buf, out_len));

		ret = compare_buffers(out_buf, vec.hash, out_len);
		if(ret) {
			fprintf(stderr, "%s-%i Failed\n", test_name, out_len);
			break;
		}
	}


	if (!ret)
		printf("%s passed!\n", test_name);

	free(out_buf);
	free(in_buf);

	return ret;
}